

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
TransformPromiseNode<kj::Promise<unsigned_long>,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:1136:13),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::Promise<unsigned_long>,_unsigned_long,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:1136:13),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  void *__src;
  AsyncInputStream *pAVar1;
  undefined8 uVar2;
  size_t sVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ExceptionOr<unsigned_long> depResult;
  ExceptionOr<kj::Promise<unsigned_long>_> local_5d0;
  Exception local_458;
  ExceptionOrValue local_2f8;
  char local_198;
  long local_190;
  Exception local_188;
  
  local_2f8.exception.ptr.isSet = false;
  local_198 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_2f8);
  uVar7 = local_2f8.exception.ptr.field_1.value.context.ptr.ptr;
  uVar6 = local_2f8.exception.ptr.field_1.value.description.content.size_;
  uVar5 = local_2f8.exception.ptr.field_1.value.description.content.ptr;
  uVar4 = local_2f8.exception.ptr.field_1.value.ownFile.content.size_;
  uVar2 = local_2f8.exception.ptr.field_1.value.ownFile.content.ptr;
  if (local_2f8.exception.ptr.isSet == true) {
    __src = (void *)((long)&local_2f8.exception.ptr.field_1 + 0x50);
    local_188.ownFile.content.ptr = local_2f8.exception.ptr.field_1.value.ownFile.content.ptr;
    local_188.ownFile.content.size_ = local_2f8.exception.ptr.field_1.value.ownFile.content.size_;
    local_188.ownFile.content.disposer =
         local_2f8.exception.ptr.field_1.value.ownFile.content.disposer;
    local_2f8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_2f8.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_188.file = local_2f8.exception.ptr.field_1.value.file;
    local_188.line = local_2f8.exception.ptr.field_1.value.line;
    local_188.type = local_2f8.exception.ptr.field_1.value.type;
    local_188.description.content.ptr =
         local_2f8.exception.ptr.field_1.value.description.content.ptr;
    local_188.description.content.size_ =
         local_2f8.exception.ptr.field_1.value.description.content.size_;
    local_188.description.content.disposer =
         local_2f8.exception.ptr.field_1.value.description.content.disposer;
    local_2f8.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_2f8.exception.ptr.field_1.value.description.content.size_ = 0;
    local_188.context.ptr.disposer = local_2f8.exception.ptr.field_1.value.context.ptr.disposer;
    local_188.context.ptr.ptr = local_2f8.exception.ptr.field_1.value.context.ptr.ptr;
    local_2f8.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    memcpy(local_188.trace,__src,0x104);
    local_458.ownFile.content.ptr = (char *)uVar2;
    local_458.ownFile.content.size_ = uVar4;
    local_458.ownFile.content.disposer =
         local_2f8.exception.ptr.field_1.value.ownFile.content.disposer;
    local_188.ownFile.content.ptr = (char *)0x0;
    local_188.ownFile.content.size_ = 0;
    local_458.file = local_2f8.exception.ptr.field_1.value.file;
    local_458.line = local_2f8.exception.ptr.field_1.value.line;
    local_458.type = local_2f8.exception.ptr.field_1.value.type;
    local_458.description.content.ptr = (char *)uVar5;
    local_458.description.content.size_ = uVar6;
    local_458.description.content.disposer =
         local_2f8.exception.ptr.field_1.value.description.content.disposer;
    local_188.description.content.ptr = (char *)0x0;
    local_188.description.content.size_ = 0;
    local_458.context.ptr.disposer = local_2f8.exception.ptr.field_1.value.context.ptr.disposer;
    local_458.context.ptr.ptr = (Context *)uVar7;
    local_188.context.ptr.ptr = (Context *)0x0;
    memcpy(local_458.trace,__src,0x104);
    local_5d0.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr = (char *)uVar2
    ;
    local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ = uVar4;
    local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_2f8.exception.ptr.field_1.value.ownFile.content.disposer;
    local_458.ownFile.content.ptr = (char *)0x0;
    local_458.ownFile.content.size_ = 0;
    local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_2f8.exception.ptr.field_1.value.file;
    local_5d0.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_2f8.exception.ptr.field_1._32_8_;
    local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         (char *)uVar5;
    local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ = uVar6;
    local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_2f8.exception.ptr.field_1.value.description.content.disposer;
    local_458.description.content.ptr = (char *)0x0;
    local_458.description.content.size_ = 0;
    local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_2f8.exception.ptr.field_1.value.context.ptr.disposer;
    local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr = (Context *)uVar7;
    local_458.context.ptr.ptr = (Context *)0x0;
    memcpy((void *)((long)&local_5d0.super_ExceptionOrValue.exception.ptr.field_1 + 0x50),__src,
           0x104);
    local_5d0.value.ptr.isSet = false;
    Exception::~Exception(&local_458);
    ExceptionOr<kj::Promise<unsigned_long>_>::operator=
              ((ExceptionOr<kj::Promise<unsigned_long>_> *)output,&local_5d0);
    uVar2 = local_5d0.value.ptr.field_1.value.super_PromiseBase.node.ptr;
    if ((local_5d0.value.ptr.isSet == true) &&
       (local_5d0.value.ptr.field_1.value.super_PromiseBase.node.ptr != (PromiseNode *)0x0)) {
      local_5d0.value.ptr.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**(local_5d0.value.ptr.field_1.value.super_PromiseBase.node.disposer)->_vptr_Disposer)
                (local_5d0.value.ptr.field_1.value.super_PromiseBase.node.disposer,
                 (_func_int *)
                 ((long)&((PromiseNode *)uVar2)->_vptr_PromiseNode +
                 (long)((PromiseNode *)uVar2)->_vptr_PromiseNode[-2]));
    }
    if (local_5d0.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    Exception::~Exception(&local_188);
  }
  else if (local_198 == '\x01') {
    if ((local_190 != 3) && (Debug::minSeverity < 3)) {
      Debug::log<char_const(&)[24]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
                 ,0x471,ERROR,"\"failed: expected \" \"i == 3\"",
                 (char (*) [24])"failed: expected i == 3");
    }
    pAVar1 = (((this->func).pipe)->in).ptr;
    (*pAVar1->_vptr_AsyncInputStream[3])(&local_458,pAVar1,(((this->func).pipe2)->out).ptr,3);
    local_5d0.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_5d0.value.ptr.isSet = true;
    local_5d0.value.ptr.field_1.value.super_PromiseBase.node.disposer =
         (Disposer *)local_458.ownFile.content.ptr;
    local_5d0.value.ptr.field_1.value.super_PromiseBase.node.ptr =
         (PromiseNode *)local_458.ownFile.content.size_;
    local_458.ownFile.content.size_ = 0;
    ExceptionOr<kj::Promise<unsigned_long>_>::operator=
              ((ExceptionOr<kj::Promise<unsigned_long>_> *)output,&local_5d0);
    uVar2 = local_5d0.value.ptr.field_1.value.super_PromiseBase.node.ptr;
    if ((local_5d0.value.ptr.isSet == true) &&
       (local_5d0.value.ptr.field_1.value.super_PromiseBase.node.ptr != (PromiseNode *)0x0)) {
      local_5d0.value.ptr.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**(local_5d0.value.ptr.field_1.value.super_PromiseBase.node.disposer)->_vptr_Disposer)
                (local_5d0.value.ptr.field_1.value.super_PromiseBase.node.disposer,
                 (_func_int *)
                 ((long)&((PromiseNode *)uVar2)->_vptr_PromiseNode +
                 (long)((PromiseNode *)uVar2)->_vptr_PromiseNode[-2]));
    }
    if (local_5d0.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_5d0.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    sVar3 = local_458.ownFile.content.size_;
    if ((PromiseNode *)local_458.ownFile.content.size_ != (PromiseNode *)0x0) {
      local_458.ownFile.content.size_ = 0;
      (***(_func_int ***)local_458.ownFile.content.ptr)
                (local_458.ownFile.content.ptr,
                 (_func_int *)((long)(_func_int ***)sVar3 + (long)(*(_func_int ***)sVar3)[-2]));
    }
  }
  if (local_2f8.exception.ptr.isSet == true) {
    Exception::~Exception(&local_2f8.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }